

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void __thiscall Liby::TcpClient::TcpClient(TcpClient *this,EventLoop *loop,SockPtr *socket)

{
  Poller *pPVar1;
  SockPtr *socket_local;
  EventLoop *loop_local;
  TcpClient *this_local;
  
  std::enable_shared_from_this<Liby::TcpClient>::enable_shared_from_this
            (&this->super_enable_shared_from_this<Liby::TcpClient>);
  TimerMixin::TimerMixin(&this->super_TimerMixin);
  (this->super_TimerMixin)._vptr_TimerMixin = (_func_int **)&PTR__TcpClient_0018f730;
  std::shared_ptr<Liby::BaseContext>::shared_ptr(&this->context_);
  this->loop_ = loop;
  pPVar1 = EventLoop::getPoller(loop);
  this->poller_ = pPVar1;
  std::shared_ptr<Liby::Socket>::shared_ptr(&this->socket_,socket);
  std::shared_ptr<Liby::Channel>::shared_ptr(&this->chan_);
  std::function<void_(std::shared_ptr<Liby::Connection>)>::function(&this->connector_);
  std::shared_ptr<Liby::TcpClient>::shared_ptr(&this->self_);
  return;
}

Assistant:

TcpClient::TcpClient(EventLoop *loop, SockPtr socket)
    : loop_(loop), poller_(loop->getPoller()), socket_(socket) {}